

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DefaultSkewItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ClockingDirectionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ClockingDirectionSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DefaultSkewItemSyntax *this_00;
  
  this_00 = (DefaultSkewItemSyntax *)allocate(this,0x78,8);
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar7 = args_3->kind;
  uVar8 = args_3->field_0x2;
  NVar9.raw = (args_3->numFlags).raw;
  uVar10 = args_3->rawLen;
  pIVar2 = args_3->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,DefaultSkewItem,args);
  (this_00->keyword).kind = TVar3;
  (this_00->keyword).field_0x2 = uVar4;
  (this_00->keyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (this_00->keyword).rawLen = uVar6;
  (this_00->keyword).info = pIVar1;
  (this_00->direction).ptr = args_2;
  (this_00->semi).kind = TVar7;
  (this_00->semi).field_0x2 = uVar8;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->semi).rawLen = uVar10;
  (this_00->semi).info = pIVar2;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }